

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::Init
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
           *this)

{
  Arena *this_00;
  InnerMap *this_01;
  size_type sVar1;
  void **ppvVar2;
  
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    this_01 = (InnerMap *)operator_new(0x30);
    this_01->num_elements_ = 0;
    sVar1 = InnerMap::Seed(this_01);
    this_01->seed_ = sVar1;
    this_01->table_ = (void **)0x0;
    (this_01->alloc_).arena_ = (Arena *)0x0;
    ppvVar2 = InnerMap::CreateEmptyTable(this_01,8);
    this_01->table_ = ppvVar2;
    this_01->index_of_first_non_null_ = 8;
    this_01->num_buckets_ = 8;
  }
  else {
    this_01 = (InnerMap *)
              Arena::AllocateAligned
                        (this_00,(type_info *)&Map<std::__cxx11::string,long>::InnerMap::typeinfo,
                         0x30);
    this_01->num_elements_ = 0;
    sVar1 = InnerMap::Seed(this_01);
    this_01->seed_ = sVar1;
    this_01->table_ = (void **)0x0;
    (this_01->alloc_).arena_ = this_00;
    ppvVar2 = InnerMap::CreateEmptyTable(this_01,8);
    this_01->table_ = ppvVar2;
    this_01->index_of_first_non_null_ = 8;
    this_01->num_buckets_ = 8;
    Arena::AddListNode(this_00,this_01,
                       internal::
                       arena_destruct_object<google::protobuf::Map<std::__cxx11::string,long>::InnerMap>
                      );
  }
  this->elements_ = this_01;
  return;
}

Assistant:

void Init() {
    elements_ = Arena::Create<InnerMap>(arena_, 0, hasher(), Allocator(arena_));
  }